

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::toUTF16_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,unsigned_long uval)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  allocator local_81;
  string local_80 [38];
  undefined2 local_5a;
  undefined2 local_58;
  char local_55;
  undefined1 local_54;
  undefined1 local_53;
  unsigned_short low;
  unsigned_short high;
  char out_1 [4];
  char local_2e;
  undefined1 local_2d;
  char out [2];
  undefined4 local_18;
  unsigned_long uval_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((this < (QUtil *)0xd800) || ((QUtil *)0xdfff < this)) {
    if (this < (QUtil *)0x10000) {
      local_18._1_1_ = (char)((ulong)this >> 8);
      local_2e = local_18._1_1_;
      local_18._0_1_ = SUB81(this,0);
      local_2d = (undefined1)local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&high,&local_2e,2,(allocator *)((long)&low + 1));
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&high);
      std::__cxx11::string::~string((string *)&high);
      std::allocator<char>::~allocator((allocator<char> *)((long)&low + 1));
    }
    else if ((QUtil *)((long)&__DT_RELA[0x70d].r_info + 7) < this) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,anon_var_dwarf_67650b);
    }
    else {
      local_18 = (uint)(this + -0x10000);
      uVar3 = (local_18 & 0xffc00) >> 10;
      uVar1 = (ushort)uVar3 | 0xd800;
      local_18._0_2_ = (ushort)(this + -0x10000);
      uVar2 = (ushort)local_18 & 0x3ff | 0xdc00;
      local_58._1_1_ = (char)(uVar1 >> 8);
      local_55 = local_58._1_1_;
      local_58._0_1_ = (undefined1)uVar3;
      local_54 = (undefined1)local_58;
      local_5a._1_1_ = (undefined1)(uVar2 >> 8);
      local_53 = local_5a._1_1_;
      local_5a._0_1_ = (undefined1)((ushort)local_18 & 0x3ff);
      low._0_1_ = (undefined1)local_5a;
      local_5a = uVar2;
      local_58 = uVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,&local_55,4,&local_81);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,anon_var_dwarf_67650b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::toUTF16(unsigned long uval)
{
    std::string result;
    if ((uval >= 0xd800) && (uval <= 0xdfff)) {
        result = "\xff\xfd";
    } else if (uval <= 0xffff) {
        char out[2];
        out[0] = static_cast<char>((uval & 0xff00) >> 8);
        out[1] = static_cast<char>(uval & 0xff);
        result = std::string(out, 2);
    } else if (uval <= 0x10ffff) {
        char out[4];
        uval -= 0x10000;
        unsigned short high = static_cast<unsigned short>(((uval & 0xffc00) >> 10) + 0xd800);
        unsigned short low = static_cast<unsigned short>((uval & 0x3ff) + 0xdc00);
        out[0] = static_cast<char>((high & 0xff00) >> 8);
        out[1] = static_cast<char>(high & 0xff);
        out[2] = static_cast<char>((low & 0xff00) >> 8);
        out[3] = static_cast<char>(low & 0xff);
        result = std::string(out, 4);
    } else {
        result = "\xff\xfd";
    }

    return result;
}